

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

Image * __thiscall
sfc::Image::crop(Image *__return_storage_ptr__,Image *this,uint x,uint y,uint crop_width,
                uint crop_height,Mode mode)

{
  _Rb_tree_header *p_Var1;
  channel_vec_t *this_00;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint iy;
  uint uVar9;
  rgba_vec_t rgba_v;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  p_Var1 = &(__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_indexed_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->_indexed_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->_indexed_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&__return_storage_ptr__->_palette,&this->_palette);
  this_00 = &__return_storage_ptr__->_data;
  __return_storage_ptr__->_width = crop_width;
  __return_storage_ptr__->_height = crop_height;
  __return_storage_ptr__->_src_coord_x = x;
  __return_storage_ptr__->_src_coord_y = y;
  uVar4 = crop_height * crop_width;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(ulong)(uVar4 * 4));
  puVar2 = (__return_storage_ptr__->_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (__return_storage_ptr__->_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar5 < (ulong)((long)puVar2 - (long)puVar3); uVar5 = uVar5 + 4) {
    *(uint *)((this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start + uVar5) =
         (uint)(mode != gb) * 0x1000000 + -0x1000000;
  }
  uVar9 = this->_width;
  if (x <= uVar9) {
    uVar6 = this->_height;
    if (y <= uVar6) {
      uVar5 = (ulong)(uVar9 - x);
      if (crop_width + x <= uVar9) {
        uVar5 = (ulong)crop_width;
      }
      uVar9 = crop_height + y;
      uVar7 = uVar6 - y;
      if (uVar9 <= uVar6) {
        uVar7 = crop_height;
      }
      if (uVar6 < uVar9) {
        uVar9 = uVar6;
      }
      iVar8 = 0;
      for (uVar6 = y; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        memcpy((__return_storage_ptr__->_data).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + __return_storage_ptr__->_width * iVar8,
               (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + (this->_width * uVar6 + x) * 4,
               (ulong)(uint)((int)uVar5 * 4));
        iVar8 = iVar8 + 4;
      }
      if ((this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&__return_storage_ptr__->_indexed_data,(ulong)uVar4);
        for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          memcpy((__return_storage_ptr__->_indexed_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + __return_storage_ptr__->_width * uVar4,
                 (this->_indexed_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + ((y + uVar4) * this->_width + x),uVar5);
        }
      }
      to_rgba((rgba_vec_t *)&local_78,this_00);
      std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
      set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_60
                 ,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   )local_78._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_78._M_impl.super__Vector_impl_data._M_finish);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::operator=(&(__return_storage_ptr__->_colors)._M_t,&local_60);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_60);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
      return __return_storage_ptr__;
    }
  }
  if ((this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&__return_storage_ptr__->_indexed_data,(ulong)uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::crop(unsigned x, unsigned y, unsigned crop_width, unsigned crop_height, Mode mode) const {
  Image img;
  img._palette = _palette;
  img._width = crop_width;
  img._height = crop_height;
  img._src_coord_x = x;
  img._src_coord_y = y;
  img._data.resize(crop_width * crop_height * 4);

  uint32_t fillval = mode == Mode::gb ? 0xff000000 : transparent_color;
  size_t fillsize = img._data.size();
  for (size_t i = 0; i < fillsize; i += 4)
    std::memcpy(img._data.data() + i, &fillval, sizeof(fillval));

  if (x > _width || y > _height) {
    // Crop outside source image: return empty
    if (_indexed_data.size())
      img._indexed_data.resize(crop_width * crop_height);
    return img;
  }

  unsigned blit_width = (x + crop_width > _width) ? _width - x : crop_width;
  unsigned blit_height = (y + crop_height > _height) ? _height - y : crop_height;

  for (unsigned iy = 0; iy < blit_height; ++iy) {
    std::memcpy(&img._data[iy * img._width * 4], &_data[(x * 4) + ((iy + y) * _width * 4)], blit_width * 4);
  }

  if (_indexed_data.size()) {
    img._indexed_data.resize(crop_width * crop_height);
    for (unsigned iy = 0; iy < blit_height; ++iy) {
      std::memcpy(&img._indexed_data[iy * img._width], &_indexed_data[x + ((iy + y) * _width)], blit_width);
    }
  }

  auto rgba_v = img.rgba_data();
  img._colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
  return img;
}